

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_7zip.c
# Opt level: O2

void test_write_format_7zip(void)

{
  int iVar1;
  mode_t mVar2;
  void *buff;
  archive *paVar3;
  archive_entry *paVar4;
  time_t tVar5;
  long lVar6;
  char *pcVar7;
  la_ssize_t lVar8;
  la_int64_t lVar9;
  size_t local_88;
  archive_entry *local_80;
  char filedata [64];
  
  test_basic((char *)0x0);
  buff = malloc(1000);
  paVar3 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                   ,L'Ō',(uint)(paVar3 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_7zip(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ō',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_7zip(a)",paVar3);
  iVar1 = archive_write_add_filter_none(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ŗ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_add_filter_none(a)",paVar3);
  iVar1 = archive_write_open_memory(paVar3,buff,1000,&local_88);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ř',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_open_memory(a, buff, buffsize, &used)",paVar3);
  paVar4 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                   ,L'Ş',(uint)(paVar4 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar4,1,100);
  tVar5 = archive_entry_mtime(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Š',1,"1",tVar5,"archive_entry_mtime(ae)",(void *)0x0);
  lVar6 = archive_entry_mtime_nsec(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'š',100,"100",lVar6,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  archive_entry_copy_pathname(paVar4,"file");
  pcVar7 = archive_entry_pathname(paVar4);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
             ,L'ţ',"file","\"file\"",pcVar7,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  archive_entry_set_mode(paVar4,0x81ed);
  mVar2 = archive_entry_mode(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ť',0x81ed,"(AE_IFREG | 0755)",(ulong)mVar2,"archive_entry_mode(ae)",
                      (void *)0x0);
  archive_entry_set_size(paVar4,8);
  iVar1 = archive_write_header(paVar3,paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ũ',0,"0",(long)iVar1,"archive_write_header(a, ae)",(void *)0x0);
  archive_entry_free(paVar4);
  lVar8 = archive_write_data(paVar3,"12345678",9);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ū',8,"8",lVar8,"archive_write_data(a, \"12345678\", 9)",(void *)0x0);
  lVar8 = archive_write_data(paVar3,"1",1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ū',0,"0",lVar8,"archive_write_data(a, \"1\", 1)",(void *)0x0);
  paVar4 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                   ,L'Ű',(uint)(paVar4 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar4,1,10);
  tVar5 = archive_entry_mtime(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ų',1,"1",tVar5,"archive_entry_mtime(ae)",(void *)0x0);
  lVar6 = archive_entry_mtime_nsec(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ų',10,"10",lVar6,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  archive_entry_copy_pathname(paVar4,"file2");
  pcVar7 = archive_entry_pathname(paVar4);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
             ,L'ŵ',"file2","\"file2\"",pcVar7,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  archive_entry_set_mode(paVar4,0x81ed);
  mVar2 = archive_entry_mode(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ŷ',0x81ed,"(AE_IFREG | 0755)",(ulong)mVar2,"archive_entry_mode(ae)",
                      (void *)0x0);
  archive_entry_set_size(paVar4,4);
  iVar1 = archive_write_header(paVar3,paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ź',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",(void *)0x0);
  archive_entry_free(paVar4);
  lVar8 = archive_write_data(paVar3,"1234",5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ż',4,"4",lVar8,"archive_write_data(a, \"1234\", 5)",(void *)0x0);
  paVar4 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                   ,L'Ɓ',(uint)(paVar4 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar4,0xb,100);
  archive_entry_copy_pathname(paVar4,"dir");
  archive_entry_set_mode(paVar4,0x41ed);
  archive_entry_set_size(paVar4,0x200);
  iVar1 = archive_write_header(paVar3,paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ƈ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar3);
  failure("size should be zero so that applications know not to write");
  lVar9 = archive_entry_size(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ɖ',0,"0",lVar9,"archive_entry_size(ae)",(void *)0x0);
  archive_entry_free(paVar4);
  lVar8 = archive_write_data(paVar3,"12345678",9);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ƌ',0,"0",lVar8,"archive_write_data(a, \"12345678\", 9)",paVar3);
  paVar4 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                   ,L'Ɛ',(uint)(paVar4 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar4,0xb,200);
  archive_entry_copy_pathname(paVar4,"dir/subdir");
  archive_entry_set_mode(paVar4,0x41ed);
  archive_entry_set_size(paVar4,0x200);
  iVar1 = archive_write_header(paVar3,paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ɩ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar3);
  failure("size should be zero so that applications know not to write");
  lVar9 = archive_entry_size(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ƙ',0,"0",lVar9,"archive_entry_size(ae)",(void *)0x0);
  archive_entry_free(paVar4);
  lVar8 = archive_write_data(paVar3,"12345678",9);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ƚ',0,"0",lVar8,"archive_write_data(a, \"12345678\", 9)",paVar3);
  paVar4 = archive_entry_new();
  local_80 = paVar4;
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                   ,L'Ɵ',(uint)(paVar4 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar4,0xb,300);
  archive_entry_copy_pathname(paVar4,"dir/subdir/subdir");
  archive_entry_set_mode(paVar4,0x41ed);
  archive_entry_set_size(paVar4,0x200);
  iVar1 = archive_write_header(paVar3,paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ƥ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar3);
  failure("size should be zero so that applications know not to write");
  lVar9 = archive_entry_size(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ƨ',0,"0",lVar9,"archive_entry_size(ae)",(void *)0x0);
  archive_entry_free(paVar4);
  lVar8 = archive_write_data(paVar3,"12345678",9);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ʃ',0,"0",lVar8,"archive_write_data(a, \"12345678\", 9)",paVar3);
  iVar1 = archive_write_close(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ƭ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",(void *)0x0);
  iVar1 = archive_write_free(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ƭ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ư',buff,"buff",anon_var_dwarf_fcd92,
                      "\"\\x37\\x7a\\xbc\\xaf\\x27\\x1c\\x00\\x03\"",8,"8",(void *)0x0);
  paVar3 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                   ,L'ƶ',(uint)(paVar3 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_format_all(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ʒ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar3)
  ;
  iVar1 = archive_read_support_filter_all(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ƹ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar3)
  ;
  iVar1 = read_open_memory_seek(paVar3,buff,local_88,7);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ƹ',0,"ARCHIVE_OK",(long)iVar1,"read_open_memory_seek(a, buff, used, 7)",
                      paVar3);
  iVar1 = archive_read_next_header(paVar3,&local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ƾ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3);
  tVar5 = archive_entry_mtime(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ƿ',1,"1",tVar5,"archive_entry_mtime(ae)",(void *)0x0);
  lVar6 = archive_entry_mtime_nsec(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ǀ',100,"100",lVar6,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar5 = archive_entry_atime(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ǁ',0,"0",tVar5,"archive_entry_atime(ae)",(void *)0x0);
  tVar5 = archive_entry_ctime(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ǂ',0,"0",tVar5,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar7 = archive_entry_pathname(local_80);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
             ,L'ǃ',"file","\"file\"",pcVar7,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar2 = archive_entry_mode(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ǆ',0x81ed,"AE_IFREG | 0755",(ulong)mVar2,"archive_entry_mode(ae)",
                      (void *)0x0);
  lVar9 = archive_entry_size(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ǅ',8,"8",lVar9,"archive_entry_size(ae)",(void *)0x0);
  lVar8 = archive_read_data(paVar3,filedata,0x40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ǉ',8,"8",lVar8,"archive_read_data(a, filedata, sizeof(filedata))",paVar3);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ǈ',filedata,"filedata","12345678","\"12345678\"",8,"8",(void *)0x0);
  iVar1 = archive_read_next_header(paVar3,&local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ǎ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3);
  tVar5 = archive_entry_mtime(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ǐ',1,"1",tVar5,"archive_entry_mtime(ae)",(void *)0x0);
  lVar6 = archive_entry_mtime_nsec(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ǐ',0,"0",lVar6,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar5 = archive_entry_atime(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ǒ',0,"0",tVar5,"archive_entry_atime(ae)",(void *)0x0);
  tVar5 = archive_entry_ctime(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ǒ',0,"0",tVar5,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar7 = archive_entry_pathname(local_80);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
             ,L'Ǔ',"file2","\"file2\"",pcVar7,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar2 = archive_entry_mode(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ǔ',0x81ed,"AE_IFREG | 0755",(ulong)mVar2,"archive_entry_mode(ae)",
                      (void *)0x0);
  lVar9 = archive_entry_size(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ǖ',4,"4",lVar9,"archive_entry_size(ae)",(void *)0x0);
  lVar8 = archive_read_data(paVar3,filedata,0x40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ǘ',4,"4",lVar8,"archive_read_data(a, filedata, sizeof(filedata))",paVar3);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ǘ',filedata,"filedata","1234","\"1234\"",4,"4",(void *)0x0);
  iVar1 = archive_read_next_header(paVar3,&local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ǝ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3);
  tVar5 = archive_entry_mtime(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ǟ',0xb,"11",tVar5,"archive_entry_mtime(ae)",(void *)0x0);
  lVar6 = archive_entry_mtime_nsec(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ǟ',300,"300",lVar6,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar5 = archive_entry_atime(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ǡ',0,"0",tVar5,"archive_entry_atime(ae)",(void *)0x0);
  tVar5 = archive_entry_ctime(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ǡ',0,"0",tVar5,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar7 = archive_entry_pathname(local_80);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
             ,L'Ǣ',"dir/subdir/subdir/","\"dir/subdir/subdir/\"",pcVar7,
             "archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar2 = archive_entry_mode(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ǣ',0x41ed,"AE_IFDIR | 0755",(ulong)mVar2,"archive_entry_mode(ae)",
                      (void *)0x0);
  lVar9 = archive_entry_size(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ǥ',0,"0",lVar9,"archive_entry_size(ae)",(void *)0x0);
  lVar8 = archive_read_data(paVar3,filedata,10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ǥ',0,"0",lVar8,"archive_read_data(a, filedata, 10)",paVar3);
  iVar1 = archive_read_next_header(paVar3,&local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ǫ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3);
  tVar5 = archive_entry_mtime(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ǫ',0xb,"11",tVar5,"archive_entry_mtime(ae)",(void *)0x0);
  lVar6 = archive_entry_mtime_nsec(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ǭ',200,"200",lVar6,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar5 = archive_entry_atime(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ǭ',0,"0",tVar5,"archive_entry_atime(ae)",(void *)0x0);
  tVar5 = archive_entry_ctime(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ǯ',0,"0",tVar5,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar7 = archive_entry_pathname(local_80);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
             ,L'ǯ',"dir/subdir/","\"dir/subdir/\"",pcVar7,"archive_entry_pathname(ae)",(void *)0x0,
             L'\0');
  mVar2 = archive_entry_mode(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ǰ',0x41ed,"AE_IFDIR | 0755",(ulong)mVar2,"archive_entry_mode(ae)",
                      (void *)0x0);
  lVar9 = archive_entry_size(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ǳ',0,"0",lVar9,"archive_entry_size(ae)",(void *)0x0);
  lVar8 = archive_read_data(paVar3,filedata,10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ǲ',0,"0",lVar8,"archive_read_data(a, filedata, 10)",paVar3);
  iVar1 = archive_read_next_header(paVar3,&local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ƿ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3);
  tVar5 = archive_entry_mtime(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ǹ',0xb,"11",tVar5,"archive_entry_mtime(ae)",(void *)0x0);
  lVar6 = archive_entry_mtime_nsec(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ǹ',100,"100",lVar6,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar5 = archive_entry_atime(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ǻ',0,"0",tVar5,"archive_entry_atime(ae)",(void *)0x0);
  tVar5 = archive_entry_ctime(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ǻ',0,"0",tVar5,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar7 = archive_entry_pathname(local_80);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
             ,L'Ǽ',"dir/","\"dir/\"",pcVar7,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar2 = archive_entry_mode(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ǽ',0x41ed,"AE_IFDIR | 0755",(ulong)mVar2,"archive_entry_mode(ae)",
                      (void *)0x0);
  lVar9 = archive_entry_size(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ǿ',0,"0",lVar9,"archive_entry_size(ae)",(void *)0x0);
  lVar8 = archive_read_data(paVar3,filedata,10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ǿ',0,"0",lVar8,"archive_read_data(a, filedata, 10)",paVar3);
  iVar1 = archive_read_next_header(paVar3,&local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ȃ',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3);
  iVar1 = archive_filter_code(paVar3,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ȅ',0,"ARCHIVE_FILTER_NONE",(long)iVar1,"archive_filter_code(a, 0)",paVar3)
  ;
  iVar1 = archive_format(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ȇ',0xe0000,"ARCHIVE_FORMAT_7ZIP",(long)iVar1,"archive_format(a)",paVar3);
  iVar1 = archive_read_close(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ȉ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
  iVar1 = archive_read_free(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ȉ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  free(buff);
  return;
}

Assistant:

DEFINE_TEST(test_write_format_7zip)
{
	/* Test that making a 7-Zip archive file by default compression
	 * in whatever compressions are supported on the running platform. */
	test_basic(NULL);
	/* Test that making a 7-Zip archive file without empty files. */
	test_basic2(NULL);
}